

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O3

bool runCase(int testCase)

{
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this;
  bool bVar1;
  int i_4;
  int i_1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *this_00;
  int j;
  uint i_2;
  int iVar2;
  uint a;
  uint i;
  int iVar3;
  uint b;
  DenseGraph g;
  DenseGraph g2;
  DenseGraph g2_1;
  DenseGraph local_d8;
  DenseGraph local_a0;
  DenseGraph local_68;
  
  switch(testCase) {
  case 1:
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 3;
    local_a0.t = false;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_a0.s._M_t);
    DenseGraph::AddEdge(&local_d8,0,1);
    bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if (!bVar1) {
      this_00 = &local_d8.s;
      goto LAB_001021e6;
    }
    bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,0);
    this_00 = &local_d8.s;
    goto LAB_00101329;
  case 2:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 4;
    local_a0.t = false;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DenseGraph::AddEdge(&local_a0,0,1);
    DenseGraph::AddEdge(&local_a0,0,2);
    DenseGraph::AddEdge(&local_a0,1,2);
    DenseGraph::AddEdge(&local_a0,1,3);
    bVar1 = DenseGraph::DoesEdgeExist(&local_a0,0,1);
    if ((((bVar1) && (bVar1 = DenseGraph::DoesEdgeExist(&local_a0,0,2), bVar1)) &&
        (bVar1 = DenseGraph::DoesEdgeExist(&local_a0,1,2), bVar1)) &&
       ((bVar1 = DenseGraph::DoesEdgeExist(&local_a0,1,3), bVar1 &&
        (bVar1 = DenseGraph::DoesEdgeExist(&local_a0,0,3), !bVar1)))) {
      bVar1 = DenseGraph::DoesEdgeExist(&local_a0,1,0);
LAB_00101da3:
      this_00 = &local_a0.s;
      goto LAB_00101329;
    }
    goto LAB_001021e1;
  case 3:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 4;
    local_a0.t = false;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    DenseGraph::AddEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,2);
    DenseGraph::AddEdge(&local_d8,1,2);
    DenseGraph::AddEdge(&local_d8,1,3);
    bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if (((bVar1) && (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,2), bVar1)) &&
       ((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,2), bVar1 &&
        ((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,3), bVar1 &&
         (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,3), !bVar1)))))) {
      bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,0);
LAB_001018bb:
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&local_d8.s._M_t);
      goto LAB_00101da3;
    }
    goto LAB_001021d7;
  case 4:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 4;
    local_a0.t = false;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    DenseGraph::AddEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,2);
    DenseGraph::AddEdge(&local_d8,1,2);
    DenseGraph::AddEdge(&local_d8,1,3);
    DenseGraph::AddEdge(&local_d8,2,3);
    DenseGraph::AddEdge(&local_d8,1,0);
    DenseGraph::RemoveEdge(&local_d8,1,0);
    DenseGraph::AddEdge(&local_d8,0,3);
    DenseGraph::RemoveEdge(&local_d8,0,3);
    DenseGraph::AddEdge(&local_d8,3,2);
    DenseGraph::RemoveEdge(&local_d8,3,2);
    DenseGraph::AddEdge(&local_d8,3,3);
    bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if (((bVar1) && (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,2), bVar1)) &&
       ((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,2), bVar1 &&
        ((((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,3), bVar1 &&
           (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,2,3), bVar1)) &&
          (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,3,3), bVar1)) &&
         ((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,3), !bVar1 &&
          (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,0), !bVar1)))))))) {
      bVar1 = DenseGraph::DoesEdgeExist(&local_d8,3,2);
      goto LAB_001018bb;
    }
LAB_001021d7:
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_d8.s._M_t);
LAB_001021e1:
    this_00 = &local_a0.s;
LAB_001021e6:
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    return false;
  case 5:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 5;
    local_a0.t = false;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8.n = 5;
    local_d8.t = false;
    this = &local_d8.s;
    this_00 = &local_a0.s;
    local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::operator=(&this->_M_t,&this_00->_M_t);
    DenseGraph::RemoveEdge(&local_d8,1,2);
    DenseGraph::RemoveEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,1);
    DenseGraph::AddEdge(&local_d8,0,2);
    DenseGraph::AddEdge(&local_d8,1,2);
    DenseGraph::RemoveEdge(&local_d8,1,3);
    DenseGraph::AddEdge(&local_d8,1,3);
    DenseGraph::RemoveEdge(&local_d8,4,2);
    DenseGraph::AddEdge(&local_d8,4,2);
    DenseGraph::RemoveEdge(&local_d8,1,0);
    DenseGraph::AddEdge(&local_d8,0,3);
    DenseGraph::RemoveEdge(&local_d8,0,3);
    DenseGraph::AddEdge(&local_d8,3,2);
    DenseGraph::RemoveEdge(&local_d8,3,2);
    bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,1);
    if ((((!bVar1) || (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,2), !bVar1)) ||
        (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,2), !bVar1)) ||
       (((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,3), !bVar1 ||
         (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,4,2), !bVar1)) ||
        ((bVar1 = DenseGraph::DoesEdgeExist(&local_d8,0,3), bVar1 ||
         (bVar1 = DenseGraph::DoesEdgeExist(&local_d8,1,0), bVar1)))))) {
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::~_Rb_tree(&this->_M_t);
      goto LAB_001021e6;
    }
    bVar1 = DenseGraph::DoesEdgeExist(&local_d8,2,4);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&this->_M_t);
LAB_00101329:
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    if (bVar1 == false) {
      return true;
    }
    return false;
  case 6:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar3 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 0x14;
    local_a0.t = false;
    iVar2 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar2 + 0x7d83U ^ 0x1312a) % 0x14,
                          (iVar3 * iVar2 + 0x3baa5aU ^ iVar2 + 0x20423U) % 0x14);
      iVar2 = iVar2 + 1;
      iVar3 = iVar3 + 0xc27;
    } while (iVar2 != 100);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(iVar3 + 0x7d83U ^ 0x1312a) % 0x14,
                         (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 0x14);
      if (!bVar1) goto LAB_001021d7;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 0x14,
                         (iVar3 + 0x7d83U ^ 0x1312a) % 0x14);
      if (!bVar1) goto LAB_001021cd;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100);
    iVar2 = 0;
    do {
      iVar3 = 0;
      do {
        bVar1 = DenseGraph::DoesEdgeExist(&local_d8,iVar2,iVar3);
        if (bVar1) {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (!bVar1) goto LAB_001021cd;
        }
        else {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (bVar1) goto LAB_001021cd;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x14);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x14);
    break;
  case 7:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar2 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 0x79;
    local_a0.t = false;
    iVar3 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar3 + 0x7d83U ^ 0x1312a) % 0x79,
                          (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 0x79);
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 1000);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(iVar3 + 0x7d83U ^ 0x1312a) % 0x79,
                         (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 0x79);
      if (!bVar1) goto LAB_001021d7;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 1000);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 0x79,
                         (iVar3 + 0x7d83U ^ 0x1312a) % 0x79);
      if (!bVar1) goto LAB_001021cd;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 1000);
    iVar2 = 0;
    do {
      iVar3 = 0;
      do {
        bVar1 = DenseGraph::DoesEdgeExist(&local_d8,iVar2,iVar3);
        if (bVar1) {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (!bVar1) goto LAB_001021cd;
        }
        else {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (bVar1) goto LAB_001021cd;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x79);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x79);
    break;
  case 8:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar2 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 1000;
    local_a0.t = false;
    iVar3 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar3 + 0x7d83U ^ 0x1312a) % 1000,
                          (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 1000);
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100000);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(iVar3 + 0x7d83U ^ 0x1312a) % 1000,
                         (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 1000);
      if (!bVar1) goto LAB_001021d7;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100000);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 1000,
                         (iVar3 + 0x7d83U ^ 0x1312a) % 1000);
      if (!bVar1) goto LAB_001021cd;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100000);
    iVar2 = 0;
    do {
      iVar3 = 0;
      do {
        bVar1 = DenseGraph::DoesEdgeExist(&local_d8,iVar2,iVar3);
        if (bVar1) {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (!bVar1) goto LAB_001021cd;
        }
        else {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (bVar1) goto LAB_001021cd;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 1000);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 1000);
    break;
  case 9:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar2 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 1000;
    local_a0.t = false;
    iVar3 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      a = (iVar3 + 0x7d83U ^ 0x1312a) % 1000;
      b = (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 1000;
      DenseGraph::AddEdge(&local_a0,a,b);
      DenseGraph::RemoveEdge(&local_a0,a,b);
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_d8,(iVar3 + 0x7d83U ^ 0x1312a) % 1000,
                         (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 1000);
      if (bVar1) goto LAB_001021d7;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 100);
    goto LAB_00102326;
  case 10:
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar2 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a0.n = 999;
    local_a0.t = false;
    iVar3 = 0;
    local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0.s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      DenseGraph::AddEdge(&local_a0,(iVar3 + 0x7d83U ^ 0x1312a) % 999,
                          (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 999);
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 200000);
    DenseGraph::DenseGraph(&local_d8,&local_a0);
    local_d8.t = (bool)(local_d8.t ^ 1);
    DenseGraph::DenseGraph(&local_68,&local_d8);
    local_a0.t = (bool)(local_68.t ^ 1);
    this_00 = &local_a0.s;
    local_a0.n = local_68.n;
    local_68.t = local_a0.t;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::operator=(&this_00->_M_t,&local_68.s._M_t);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_68.s._M_t);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_a0,(iVar3 + 0x7d83U ^ 0x1312a) % 999,
                         (iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 999);
      if (!bVar1) goto LAB_00102355;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 200000);
    DenseGraph::DenseGraph(&local_68,&local_a0);
    local_68.t = (bool)(local_68.t ^ 1);
    iVar2 = 0;
    iVar3 = 0;
    do {
      bVar1 = DenseGraph::DoesEdgeExist
                        (&local_68,(iVar2 * iVar3 + 0x3baa5aU ^ iVar3 + 0x20423U) % 999,
                         (iVar3 + 0x7d83U ^ 0x1312a) % 999);
      if (!bVar1) goto LAB_0010234b;
      iVar3 = iVar3 + 1;
      iVar2 = iVar2 + 0xc27;
    } while (iVar3 != 200000);
    iVar2 = 0;
    do {
      iVar3 = 0;
      do {
        bVar1 = DenseGraph::DoesEdgeExist(&local_a0,iVar2,iVar3);
        if (bVar1) {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (!bVar1) goto LAB_0010234b;
        }
        else {
          bVar1 = DenseGraph::DoesEdgeExist(&local_68,iVar3,iVar2);
          if (bVar1) goto LAB_0010234b;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 999);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 999);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_68.s._M_t);
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::~_Rb_tree(&local_d8.s._M_t);
    goto LAB_00102335;
  default:
    goto LAB_001021ed;
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_68.s._M_t);
LAB_00102326:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_d8.s._M_t);
LAB_00102335:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_a0.s._M_t);
LAB_001021ed:
  return true;
LAB_0010234b:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_68.s._M_t);
LAB_00102355:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_d8.s._M_t);
  goto LAB_001021e6;
LAB_001021cd:
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_68.s._M_t);
  goto LAB_001021d7;
}

Assistant:

bool runCase(int testCase) {
    if (testCase == 1) {
        DenseGraph g;
        g.AddEdge(0,1);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 2) {
        DenseGraph g(4);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 3) {
        DenseGraph g2(4);
        DenseGraph g(g2);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
    } else
    if (testCase == 4) {
        DenseGraph g2(4);
        DenseGraph g = g2;
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.AddEdge(1,3);
        g.AddEdge(2,3);
        g.AddEdge(1,0);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);
        g.AddEdge(3,3);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(2,3)) return false;
        if (!g.DoesEdgeExist(3,3)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(3,2)) return false;


    } else
    if (testCase == 5) {
        DenseGraph g2(5);
        DenseGraph g(2);
        g = g2;
        g.RemoveEdge(1,2);
        g.RemoveEdge(0,1);
        g.AddEdge(0,1);
        g.AddEdge(0,2);
        g.AddEdge(1,2);
        g.RemoveEdge(1,3);
        g.AddEdge(1,3);
        g.RemoveEdge(4,2);
        g.AddEdge(4,2);
        g.RemoveEdge(1,0);
        g.AddEdge(0,3);
        g.RemoveEdge(0,3);
        g.AddEdge(3,2);
        g.RemoveEdge(3,2);

        if (!g.DoesEdgeExist(0,1)) return false;
        if (!g.DoesEdgeExist(0,2)) return false;
        if (!g.DoesEdgeExist(1,2)) return false;
        if (!g.DoesEdgeExist(1,3)) return false;
        if (!g.DoesEdgeExist(4,2)) return false;
        if (g.DoesEdgeExist(0,3)) return false;
        if (g.DoesEdgeExist(1,0)) return false;
        if (g.DoesEdgeExist(2,4)) return false;
    } else
    if (testCase == 6) {
        int n = 20;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }


    } else
    if (testCase == 7) {
        int n = 121;
        int k = 1000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 8) {
        int n = 1000;
        int k = 100000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (g.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    } else
    if (testCase == 9) {
        int n = 1000;
        int k = 100;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
            gt.RemoveEdge(a,b);
        }
        DenseGraph g = gt;
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (g.DoesEdgeExist(a,b)) return false;
        }
    } else
    if (testCase == 10) {
        int n = 999;
        int k = 200000;
        DenseGraph gt(n);
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            gt.AddEdge(a,b);
        }
        DenseGraph g = gt.Transpose();
        gt = g.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!gt.DoesEdgeExist(a,b)) return false;
        }
        DenseGraph g2 = gt.Transpose();
        for (unsigned int i = 0; i < k; i++) {
            int a = (int)(((i+32131)^77811+311) % n);
            int b = (int)(((i+132131)^778117+3111*i*i+3132117) % n);
            if (!g2.DoesEdgeExist(b,a)) return false;
        }
        for (int i = 0; i < n; i++) {
            for (int j = 0; j < n; j++) {
                if (gt.DoesEdgeExist(i,j)) {
                    if (!g2.DoesEdgeExist(j,i)) return false;
                } else {
                    if (g2.DoesEdgeExist(j,i)) return false;
                }
            }
        }
    }
    return true;
}